

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5ExprNodeNext_STRING(Fts5Expr *pExpr,Fts5ExprNode *pNode,int bFromValid,i64 iFrom)

{
  Fts5ExprPhrase *pFVar1;
  long lVar2;
  Fts5IndexIter *pFVar3;
  bool bVar4;
  int iVar5;
  Fts5ExprTerm *pFVar6;
  Fts5ExprTerm *pFVar7;
  long lVar8;
  bool bVar9;
  
  pFVar1 = pNode->pNear->apPhrase[0];
  pNode->bNomatch = 0;
  if (pFVar1->aTerm[0].pSynonym == (Fts5ExprTerm *)0x0) {
    pFVar3 = pFVar1->aTerm[0].pIter;
    if (bFromValid == 0) {
      iVar5 = sqlite3Fts5IterNext(pFVar3);
    }
    else {
      iVar5 = sqlite3Fts5IterNextFrom(pFVar3,iFrom);
    }
    bVar9 = true;
    if (iVar5 == 0) {
      bVar9 = pFVar3->bEof != '\0';
    }
  }
  else {
    pFVar7 = pFVar1->aTerm;
    lVar8 = 0;
    bVar9 = false;
    pFVar6 = pFVar7;
    do {
      if ((pFVar6->pIter->bEof == '\0') &&
         ((lVar2 = pFVar6->pIter->iRowid, !bVar9 ||
          (bVar9 = true, pExpr->bDesc != (uint)(lVar2 < lVar8))))) {
        bVar9 = true;
        lVar8 = lVar2;
      }
      pFVar6 = pFVar6->pSynonym;
    } while (pFVar6 != (Fts5ExprTerm *)0x0);
    bVar9 = true;
    do {
      pFVar3 = pFVar7->pIter;
      bVar4 = bVar9;
      if (pFVar3->bEof == '\0') {
        lVar2 = pFVar3->iRowid;
        if (lVar2 == lVar8) {
          if (bFromValid != 0) goto LAB_001df87a;
          iVar5 = sqlite3Fts5IterNext(pFVar3);
        }
        else {
          bVar4 = false;
          if (((bFromValid == 0) || (bVar4 = false, lVar2 == iFrom)) ||
             (pExpr->bDesc != (uint)(iFrom < lVar2))) goto LAB_001df89d;
LAB_001df87a:
          iVar5 = sqlite3Fts5IterNextFrom(pFVar3,iFrom);
        }
        if (iVar5 != 0) goto LAB_001df8a9;
        bVar4 = bVar9;
        if (pFVar7->pIter->bEof == '\0') {
          bVar4 = false;
        }
      }
LAB_001df89d:
      bVar9 = bVar4;
      pFVar7 = pFVar7->pSynonym;
    } while (pFVar7 != (Fts5ExprTerm *)0x0);
    iVar5 = 0;
LAB_001df8a9:
    bVar9 = bVar9 || iVar5 != 0;
  }
  pNode->bEof = (uint)bVar9;
  if (bVar9 == false) {
    iVar5 = fts5ExprNodeTest_STRING(pExpr,pNode);
    return iVar5;
  }
  return iVar5;
}

Assistant:

static int fts5ExprNodeNext_STRING(
  Fts5Expr *pExpr,                /* Expression pPhrase belongs to */
  Fts5ExprNode *pNode,            /* FTS5_STRING or FTS5_TERM node */
  int bFromValid,
  i64 iFrom
){
  Fts5ExprTerm *pTerm = &pNode->pNear->apPhrase[0]->aTerm[0];
  int rc = SQLITE_OK;

  pNode->bNomatch = 0;
  if( pTerm->pSynonym ){
    int bEof = 1;
    Fts5ExprTerm *p;

    /* Find the firstest rowid any synonym points to. */
    i64 iRowid = fts5ExprSynonymRowid(pTerm, pExpr->bDesc, 0);

    /* Advance each iterator that currently points to iRowid. Or, if iFrom
    ** is valid - each iterator that points to a rowid before iFrom.  */
    for(p=pTerm; p; p=p->pSynonym){
      if( sqlite3Fts5IterEof(p->pIter)==0 ){
        i64 ii = p->pIter->iRowid;
        if( ii==iRowid
         || (bFromValid && ii!=iFrom && (ii>iFrom)==pExpr->bDesc)
        ){
          if( bFromValid ){
            rc = sqlite3Fts5IterNextFrom(p->pIter, iFrom);
          }else{
            rc = sqlite3Fts5IterNext(p->pIter);
          }
          if( rc!=SQLITE_OK ) break;
          if( sqlite3Fts5IterEof(p->pIter)==0 ){
            bEof = 0;
          }
        }else{
          bEof = 0;
        }
      }
    }

    /* Set the EOF flag if either all synonym iterators are at EOF or an
    ** error has occurred.  */
    pNode->bEof = (rc || bEof);
  }else{
    Fts5IndexIter *pIter = pTerm->pIter;

    assert( Fts5NodeIsString(pNode) );
    if( bFromValid ){
      rc = sqlite3Fts5IterNextFrom(pIter, iFrom);
    }else{
      rc = sqlite3Fts5IterNext(pIter);
    }

    pNode->bEof = (rc || sqlite3Fts5IterEof(pIter));
  }

  if( pNode->bEof==0 ){
    assert( rc==SQLITE_OK );
    rc = fts5ExprNodeTest_STRING(pExpr, pNode);
  }

  return rc;
}